

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O2

void __thiscall
agge::layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
          (layout *this,annotated_string<char,_agge::font_style_annotation> *text,
          undefined8 *param_3)

{
  float fVar1;
  byte bVar2;
  pointer pcVar3;
  positioned_glyph *ppVar4;
  glyph *pgVar5;
  long lVar6;
  pointer ptVar7;
  pointer ptVar8;
  ulong uVar9;
  byte *pbVar10;
  byte *pbVar11;
  byte *pbVar12;
  uint uVar13;
  float fVar14;
  ptr font_;
  const_iterator range;
  layout_builder builder;
  const_iterator ranges_end;
  
  pod_vector<agge::positioned_glyph>::resize
            (&this->_glyphs,(count_t)(text->_underlying)._M_string_length);
  (this->_box).w = 0.0;
  (this->_box).h = 0.0;
  layout_builder::layout_builder(&builder,&this->_glyphs,&this->_glyph_runs,&this->_text_lines);
  annotated_string<char,_agge::font_style_annotation>::ranges_begin(&range,text);
  annotated_string<char,_agge::font_style_annotation>::ranges_end(&ranges_end,text);
  do {
    if ((range._current.
         super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .begin_index ==
         ranges_end._current.
         super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .begin_index) &&
       (range._current.
        super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .end_index ==
        ranges_end._current.
        super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .end_index)) {
      layout_builder::break_current_line(&builder);
      ptVar7 = (this->_text_lines).
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_start;
      ptVar8 = (this->_text_lines).
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
      (this->_text_lines).super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
      _M_impl.super__Vector_impl_data._M_finish = ptVar8;
      fVar14 = (this->_box).w;
      for (; ptVar7 != ptVar8; ptVar7 = ptVar7 + 1) {
        fVar1 = ptVar7->extent;
        if (fVar14 < fVar1) {
          (this->_box).w = fVar1;
          fVar14 = fVar1;
        }
        (this->_box).h = (ptVar7->offset).dy + ptVar7->descent;
      }
      return;
    }
    (**(code **)*param_3)(&font_,param_3,range._current._annotation);
    layout_builder::begin_style(&builder,&font_);
    pcVar3 = ((range._current.
               super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._container)->_M_dataplus)._M_p;
    pbVar11 = (byte *)(pcVar3 + range._current.
                                super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                .begin_index);
    pbVar10 = (byte *)(pcVar3 + range._current.
                                super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                .end_index);
    while (pbVar11 != pbVar10) {
      bVar2 = *pbVar11;
      uVar13 = (uint)bVar2;
      if (bVar2 == 10) {
        pbVar11 = pbVar11 + 1;
        layout_builder::break_current_line(&builder);
      }
      else {
        pbVar12 = pbVar11 + 1;
        pbVar11 = pbVar12;
        if ((char)bVar2 < '\0') {
          if (bVar2 < 0xc0) {
LAB_0016cbbc:
            uVar13 = 0xfffd;
            pbVar11 = pbVar12;
          }
          else {
            uVar13 = 0x1f;
            lVar6 = 1;
            if (0xdf < bVar2) {
              uVar13 = 0xf;
              lVar6 = 2;
              if (0xef < bVar2) {
                uVar13 = 7;
                lVar6 = 3;
                if (0xf7 < bVar2) goto LAB_0016cbbc;
              }
            }
            if (lVar6 <= (long)pbVar10 - (long)pbVar12) {
              uVar13 = bVar2 & uVar13;
              pbVar11 = pbVar12 + lVar6;
              do {
                if ((*pbVar12 & 0xffffffc0) != 0x80) goto LAB_0016cbbc;
                uVar13 = *pbVar12 & 0x3f | uVar13 << 6;
                pbVar12 = pbVar12 + 1;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              goto LAB_0016cba4;
            }
            uVar13 = 0xfffd;
            pbVar11 = pbVar10;
          }
LAB_0016cbfa:
          pgVar5 = font::get_glyph_for_codepoint_slow
                             (font_.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,uVar13);
        }
        else {
LAB_0016cba4:
          if ((0x7f < uVar13) ||
             (pgVar5 = (font_.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       _ansi_glyphs[uVar13], pgVar5 == (glyph *)0x0)) goto LAB_0016cbfa;
        }
        fVar14 = (pgVar5->metrics).advance_x;
        uVar9 = (ulong)builder._state.next;
        builder._state.next = builder._state.next + 1;
        ppVar4 = (builder._glyphs)->_begin;
        ppVar4[uVar9].index = pgVar5->index;
        ppVar4[uVar9].d.dx = fVar14;
        ppVar4[uVar9].d.dy = 0.0;
        builder._state.extent = fVar14 + builder._state.extent;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&font_.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    annotated_string<char,_agge::font_style_annotation>::const_iterator::operator++(&range);
  } while( true );
}

Assistant:

inline void layout::process(const richtext_t &text, LimiterT limiter, FontFactoryT &font_factory_)
	{
		_glyphs.resize(static_cast<count_t>(text.size()));
		_box = zero();

		layout_builder builder(_glyphs, _glyph_runs, _text_lines);

		for (richtext_t::const_iterator range = text.ranges_begin(), ranges_end = text.ranges_end(); range != ranges_end;
			++range)
		{
			const font::ptr font_ = font_factory_.create_font(range->get_annotation().basic);

			builder.begin_style(font_);
			limiter.begin_style(static_cast<const layout_builder &>(builder));
			for (std::string::const_iterator i = range->begin(), end = range->end(); i != end; )
			{
				if (eat_lf(i))
				{
					builder.break_current_line();
					limiter.new_line();
					continue;
				}

				std::string::const_iterator next = i;
				const glyph &g = *font_->get_glyph_for_codepoint(utfia::utf8::next(next, end));

				if (!limiter.add_glyph(builder, g.index, g.metrics.advance_x, i, next, end))
				{
					_text_lines.clear();
					return;
				}
			}
		}
		builder.break_current_line();
		_text_lines.pop_back();
		for (text_lines_container_t::const_iterator i = _text_lines.begin(); i != _text_lines.end(); ++i)
		{
			if (i->extent > _box.w)
				_box.w = i->extent;
			_box.h = i->offset.dy + i->descent;
		}
	}